

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGCG_SolverNonserialDynamicProgramming.cpp
# Opt level: O1

LIndex __thiscall
BGCG_SolverNonserialDynamicProgramming::GetJpolIndexForBestResponses
          (BGCG_SolverNonserialDynamicProgramming *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *agentOrdering)

{
  int *piVar1;
  sp_counted_base *psVar2;
  pointer pSVar3;
  long lVar4;
  int iVar5;
  Index IVar6;
  undefined4 extraout_var;
  LIndex i;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  pointer puVar11;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nrPols;
  vector<unsigned_int,_std::allocator<unsigned_int>_> selectedBRIs;
  vector<unsigned_int,_std::allocator<unsigned_int>_> restrictedBRIs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nrNeighborsPolicies;
  allocator_type local_a9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_50;
  void *local_48 [2];
  long local_38;
  size_type __n;
  
  psVar2 = (this->super_BGCG_Solver)._m_bgcg.pn.pi_;
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)(this->super_BGCG_Solver)._m_bgcg.px;
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)(this->super_BGCG_Solver)._m_bgcg.pn.pi_;
  if (psVar2 != (sp_counted_base *)0x0) {
    LOCK();
    piVar1 = &psVar2->use_count_;
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  local_50 = agentOrdering;
  iVar5 = (*(((element_type *)
             local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start)->super_BayesianGameIdenticalPayoffInterface).
            super_BayesianGameBase.super_Interface_ProblemToPolicyDiscretePure.
            super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete[3])();
  __n = CONCAT44(extraout_var,iVar5);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish);
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  if (__n != 0) {
    uVar9 = 1;
    do {
      psVar2 = (this->super_BGCG_Solver)._m_bgcg.pn.pi_;
      local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)(this->super_BGCG_Solver)._m_bgcg.px;
      local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)(this->super_BGCG_Solver)._m_bgcg.pn.pi_;
      if (psVar2 != (sp_counted_base *)0x0) {
        LOCK();
        piVar1 = &psVar2->use_count_;
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      i = Interface_ProblemToPolicyDiscretePure::GetNrPolicies
                    ((Interface_ProblemToPolicyDiscretePure *)
                     local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start,uVar9 - 1,TYPE_INDEX,999999);
      IVar6 = Globals::CastLIndexToIndex(i);
      local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)(ulong)IVar6;
      if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (&local_a8,
                   (iterator)
                   local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_68);
      }
      else {
        *local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish =
             (unsigned_long)
             local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 &local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish);
      uVar7 = (ulong)uVar9;
      uVar9 = uVar9 + 1;
    } while (uVar7 < __n);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_88,__n,(allocator_type *)&local_68);
  puVar11 = (local_50->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (puVar11 !=
      (local_50->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    do {
      uVar7 = (ulong)puVar11[-1];
      pSVar3 = (this->_m_bestResponseScopes).super__Vector_base<Scope,_std::allocator<Scope>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (pSVar3[uVar7].super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          *(pointer *)
           &pSVar3[uVar7].super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl) {
        uVar10 = 0;
      }
      else {
        pSVar3 = pSVar3 + uVar7;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&local_68,
                   (long)(pSVar3->super_SDT).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   *(long *)&(pSVar3->super_SDT).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   >> 2,(allocator_type *)local_48);
        lVar4 = *(long *)&(pSVar3->super_SDT).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl;
        lVar8 = (long)(pSVar3->super_SDT).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish - lVar4;
        if (lVar8 != 0) {
          uVar10 = 0;
          do {
            local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar10] =
                 *(uint *)((long)&(((BayesianGameIdenticalPayoffInterface *)
                                   local_88.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->super_BayesianGameBase
                                  ).super_Interface_ProblemToPolicyDiscretePure.
                                  super_Interface_ProblemToPolicyDiscrete.
                                  _vptr_Interface_ProblemToPolicyDiscrete +
                          (ulong)*(uint *)(lVar4 + uVar10 * 4) * 4);
            uVar10 = uVar10 + 1;
          } while ((uVar10 & 0xffffffff) < (ulong)(lVar8 >> 2));
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_48,
                   (long)(pSVar3->super_SDT).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   *(long *)&(pSVar3->super_SDT).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   >> 2,&local_a9);
        lVar4 = *(long *)&(pSVar3->super_SDT).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl;
        lVar8 = (long)(pSVar3->super_SDT).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish - lVar4;
        if (lVar8 != 0) {
          uVar10 = 0;
          do {
            *(ulong *)((long)local_48[0] + uVar10 * 8) =
                 (ulong)(uint)local_a8.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start
                              [*(uint *)(lVar4 + uVar10 * 4)];
            uVar10 = uVar10 + 1;
          } while ((uVar10 & 0xffffffff) < (ulong)(lVar8 >> 2));
        }
        IVar6 = IndexTools::IndividualToJointIndices
                          (&local_68,
                           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_48);
        IVar6 = Globals::CastLIndexToIndex((ulong)IVar6);
        if (local_48[0] != (void *)0x0) {
          operator_delete(local_48[0],local_38 - (long)local_48[0]);
        }
        if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_68.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_68.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        uVar10 = (ulong)IVar6;
      }
      puVar11 = puVar11 + -1;
      *(undefined4 *)
       ((long)&(((BayesianGameIdenticalPayoffInterface *)
                local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start)->super_BayesianGameBase).
               super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
               _vptr_Interface_ProblemToPolicyDiscrete + uVar7 * 4) =
           *(undefined4 *)
            (*(long *)&(this->_m_bestResponses).
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar7].
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data + uVar10 * 4);
    } while (puVar11 !=
             (local_50->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start);
  }
  IVar6 = IndexTools::IndividualToJointIndices(&local_88,&local_a8);
  if ((element_type *)
      local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (element_type *)0x0) {
    operator_delete(local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (ulong)IVar6;
}

Assistant:

LIndex 
BGCG_SolverNonserialDynamicProgramming::GetJpolIndexForBestResponses(const vector<Index> &agentOrdering) const
{
    size_t nrAgents = GetBGCG()->GetNrAgents();

    //Get the nr of policies for all agents
    vector<size_t> nrPols;
    for(Index agI=0; agI < nrAgents; agI++)
        nrPols.push_back(CastLIndexToIndex(GetBGCG()->GetNrPolicies(agI)));

//we store the index, not the policy itelf
//JointPolicyPureVector(*cgbg, TYPE_INDEX ) bestJointBGPolicy;
    vector<Index > selectedBRIs(nrAgents);

    Index neighJointPol = 0;
    vector<Index>::const_reverse_iterator rit = agentOrdering.rbegin();
    while(rit != agentOrdering.rend())
    {
        Index agI=*rit;
        const Scope& brSc = _m_bestResponseScopes[agI];
#if DEBUG_BGCG_SolverNonserialDynamicProgramming
        cout << "selecting best response policy for agent "<< agI <<
            ". bestResponseScope(its neighbors) is " <<
            SoftPrint(brSc) << endl;
#endif        
        if(brSc.size() > 0)
        {
            //get the policies selected by the agents in brSc and convert
            //it to neighJointPol index
            vector<Index> restrictedBRIs(brSc.size());
            IndexTools::RestrictIndividualIndicesToScope(selectedBRIs, brSc,
                                                         restrictedBRIs);
            vector<size_t> nrNeighborsPolicies(brSc.size());
            IndexTools::RestrictIndividualIndicesToScope(nrPols, brSc,
                nrNeighborsPolicies);
/*            for(Scope::const_iterator brSc_it = brSc.begin(); 
                    brSc_it != brSc.end(); brSc_it++)
            {
                size_t nrpols = cgbg->GetNrPolicies(*brSc_it);
                nrNeighborsPolicies.push_back(nrpols);
//                nrJointNeighborPolicies *= nrpols;
            }
*/            
            Index brSc_jointIndex = CastLIndexToIndex(IndexTools::IndividualToJointIndices
                                                      (restrictedBRIs, nrNeighborsPolicies));
            neighJointPol = brSc_jointIndex;
        }
        else
            neighJointPol = 0;

        selectedBRIs[agI] = _m_bestResponses[agI][neighJointPol];

#if 0 && DEBUG_BGCG_SolverNonserialDynamicProgramming
        PolicyPureVector brPol(*GetBGCG(), agI, TYPE_INDEX);
        brPol.SetIndex(selectedBRIs[agI]);
        cout << "selecting best response for joint neighbor index "<< 
            neighJointPol <<endl;
        cout << "selected policy index selectedBRIs[agI]="<< selectedBRIs[agI]
             <<", corresponding to BG policy:"<<endl
             <<brPol.SoftPrint();
#endif        
        rit++;
    }
    
    //Get the joint policy index
    LIndex bestJointBGPolicyIndex = IndexTools::IndividualToJointIndices(
            selectedBRIs, nrPols);

    return(bestJointBGPolicyIndex);
}